

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cc
# Opt level: O3

int32 __thiscall re2::ACMRandom::Next(ACMRandom *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)this->seed_ >> 0x10;
  uVar3 = (uVar1 * 0x41a70000 & 0x7fff0000) + (this->seed_ & 0xffffU) * 0x41a7;
  uVar2 = (uVar3 & 0x7fffffff) + 1;
  if (-1 < (int)uVar3) {
    uVar2 = uVar3;
  }
  uVar2 = (uVar1 * 0x41a7 >> 0xf) + uVar2;
  uVar1 = (uVar2 & 0x7fffffff) + 1;
  if (-1 < (int)uVar2) {
    uVar1 = uVar2;
  }
  this->seed_ = uVar1;
  return uVar1;
}

Assistant:

int32 ACMRandom::Next() {
  const int32 M = 2147483647L;   // 2^31-1
  const int32 A = 16807;
  // In effect, we are computing seed_ = (seed_ * A) % M, where M = 2^31-1
  uint32 lo = A * (int32)(seed_ & 0xFFFF);
  uint32 hi = A * (int32)((uint32)seed_ >> 16);
  lo += (hi & 0x7FFF) << 16;
  if (lo > M) {
    lo &= M;
    ++lo;
  }
  lo += hi >> 15;
  if (lo > M) {
    lo &= M;
    ++lo;
  }
  return (seed_ = (int32) lo);
}